

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O1

char * parse_headers(char *buf,char *buf_end,phr_header *headers,size_t *num_headers,
                    size_t max_headers,int *ret)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  size_t value_len;
  char *value;
  size_t local_40;
  char *local_38;
  
  if (buf == buf_end) {
LAB_00107305:
    *ret = -2;
    return (char *)0x0;
  }
LAB_001071ba:
  bVar1 = *buf;
  if (bVar1 == 10) {
    return (char *)((byte *)buf + 1);
  }
  if (bVar1 != 0xd) {
    sVar5 = *num_headers;
    if (sVar5 == max_headers) goto LAB_0010730d;
    if ((sVar5 == 0) || ((bVar1 != 9 && (bVar1 != 0x20)))) {
      headers[sVar5].name = buf;
      lVar4 = 0;
      do {
        if ((ulong)(byte)*buf == 0x3a) {
          headers[sVar5].name_len = -lVar4;
          if (lVar4 != 0) {
            buf = (char *)((byte *)buf + 1);
            iVar3 = -2;
            if (buf == buf_end) goto LAB_00107263;
            goto LAB_00107240;
          }
LAB_0010725e:
          iVar3 = -1;
          goto LAB_00107263;
        }
        if (""[(byte)*buf] == '\0') goto LAB_0010725e;
        buf = (char *)((byte *)buf + 1);
        lVar4 = lVar4 + -1;
      } while (buf != buf_end);
      goto LAB_00107259;
    }
    headers[sVar5].name = (char *)0x0;
    headers[sVar5].name_len = 0;
    goto LAB_0010726f;
  }
  if ((byte *)buf + 1 != (byte *)buf_end) {
    if (((byte *)buf)[1] == 10) {
      return (char *)((byte *)buf + 2);
    }
LAB_0010730d:
    *ret = -1;
    return (char *)0x0;
  }
  goto LAB_00107305;
  while (buf = (char *)((byte *)buf + 1), buf != buf_end) {
LAB_00107240:
    if ((*buf != 0x20) && (*buf != 9)) {
      bVar2 = true;
      goto LAB_00107267;
    }
  }
LAB_00107259:
  iVar3 = -2;
  buf = buf_end;
LAB_00107263:
  *ret = iVar3;
  bVar2 = false;
LAB_00107267:
  if (!bVar2) {
    return (char *)0x0;
  }
LAB_0010726f:
  buf = get_token_to_eol(buf,buf_end,&local_38,&local_40,ret);
  if ((byte *)buf == (byte *)0x0) {
    return (char *)0x0;
  }
  sVar5 = local_40;
  if (local_40 == 0) {
LAB_001072b8:
    pcVar6 = local_38 + sVar5;
  }
  else {
    do {
      if ((local_38[sVar5 - 1] != ' ') && (local_38[sVar5 - 1] != '\t')) goto LAB_001072b8;
      sVar5 = sVar5 - 1;
      pcVar6 = local_38;
    } while (sVar5 != 0);
  }
  sVar5 = *num_headers;
  headers[sVar5].value = local_38;
  headers[sVar5].value_len = (long)pcVar6 - (long)local_38;
  if ((byte *)buf == (byte *)0x0) {
    return (char *)0x0;
  }
  *num_headers = *num_headers + 1;
  if (buf == buf_end) goto LAB_00107305;
  goto LAB_001071ba;
}

Assistant:

static const char *parse_headers(const char *buf, const char *buf_end, struct phr_header *headers, size_t *num_headers,
                                 size_t max_headers, int *ret)
{
    for (;; ++*num_headers) {
        CHECK_EOF();
        if (*buf == '\015') {
            ++buf;
            EXPECT_CHAR('\012');
            break;
        } else if (*buf == '\012') {
            ++buf;
            break;
        }
        if (*num_headers == max_headers) {
            *ret = -1;
            return NULL;
        }
        if (!(*num_headers != 0 && (*buf == ' ' || *buf == '\t'))) {
            /* parsing name, but do not discard SP before colon, see
             * http://www.mozilla.org/security/announce/2006/mfsa2006-33.html */
            headers[*num_headers].name = buf;
            static const char ALIGNED(16) ranges1[] = "\x00 "  /* control chars and up to SP */
                                                      "\"\""   /* 0x22 */
                                                      "()"     /* 0x28,0x29 */
                                                      ",,"     /* 0x2c */
                                                      "//"     /* 0x2f */
                                                      ":@"     /* 0x3a-0x40 */
                                                      "[]"     /* 0x5b-0x5d */
                                                      "{\377"; /* 0x7b-0xff */
            int found;
            buf = findchar_fast(buf, buf_end, ranges1, sizeof(ranges1) - 1, &found);
            if (!found) {
                CHECK_EOF();
            }
            while (1) {
                if (*buf == ':') {
                    break;
                } else if (!token_char_map[(unsigned char)*buf]) {
                    *ret = -1;
                    return NULL;
                }
                ++buf;
                CHECK_EOF();
            }
            if ((headers[*num_headers].name_len = buf - headers[*num_headers].name) == 0) {
                *ret = -1;
                return NULL;
            }
            ++buf;
            for (;; ++buf) {
                CHECK_EOF();
                if (!(*buf == ' ' || *buf == '\t')) {
                    break;
                }
            }
        } else {
            headers[*num_headers].name = NULL;
            headers[*num_headers].name_len = 0;
        }
        const char *value;
        size_t value_len;
        if ((buf = get_token_to_eol(buf, buf_end, &value, &value_len, ret)) == NULL) {
            return NULL;
        }
        /* remove trailing SPs and HTABs */
        const char *value_end = value + value_len;
        for (; value_end != value; --value_end) {
            const char c = *(value_end - 1);
            if (!(c == ' ' || c == '\t')) {
                break;
            }
        }
        headers[*num_headers].value = value;
        headers[*num_headers].value_len = value_end - value;
    }
    return buf;
}